

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void f_luaopen(lua_State *L,void *ud)

{
  global_State *g_00;
  lua_Number *plVar1;
  global_State *g;
  void *ud_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  stack_init(L,L);
  init_registry(L,g_00);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g_00->gcrunning = '\x01';
  plVar1 = lua_version((lua_State *)0x0);
  g_00->version = plVar1;
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g->gcrunning = 1;  /* allow gc */
  g->version = lua_version(NULL);
  luai_userstateopen(L);
}